

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OoutReportTextTest.cpp
# Opt level: O2

void __thiscall OoutReportTextTest::OoutReportTextTest(OoutReportTextTest *this)

{
  allocator<char> local_1e9;
  char local_1e8 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1e0 [2];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1d0;
  shared_ptr<oout::ErrorResult> local_1c8;
  char local_1b8 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1b0;
  shared_ptr<oout::NamedResult> local_1a8;
  shared_ptr<oout::ContainMatch> local_198;
  shared_ptr<oout::NamedTest> local_188;
  char local_178 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_170;
  shared_ptr<oout::ContainMatch> local_168;
  shared_ptr<oout::ContainMatch> local_158;
  char local_148 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_140;
  shared_ptr<oout::ErrorResult> local_138;
  char local_128 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_120;
  shared_ptr<oout::ContainMatch> local_118;
  shared_ptr<oout::NamedTest> local_108;
  char local_f8 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_f0;
  shared_ptr<oout::ContainMatch> local_e8;
  shared_ptr<oout::ContainMatch> local_d8;
  char local_c8 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_c0;
  shared_ptr<oout::FailureResult> local_b8;
  char local_a8 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_a0;
  shared_ptr<oout::ContainMatch> local_98;
  shared_ptr<oout::NamedTest> local_88;
  char local_78 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_70 [2];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_60;
  shared_ptr<oout::SuccessResult> local_58;
  shared_ptr<oout::ContainMatch> local_48;
  shared_ptr<oout::NamedTest> local_38;
  string local_28;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28,"OoutReportText tests",&local_1e9);
  std::make_shared<oout::SuccessResult>();
  std::make_shared<oout::TestResult,std::shared_ptr<oout::SuccessResult>>(&local_58);
  std::make_shared<oout::OoutReportText,std::shared_ptr<oout::TestResult>>
            ((shared_ptr<oout::TestResult> *)&local_48);
  std::make_shared<oout::ContainMatch,char_const(&)[20]>((char (*) [20])local_78);
  std::
  make_shared<oout::NamedTest,char_const(&)[42],std::shared_ptr<oout::OoutReportText>,std::shared_ptr<oout::ContainMatch>>
            ((char (*) [42])&local_38,
             (shared_ptr<oout::OoutReportText> *)"OoutReportText should show summary string",
             &local_48);
  std::make_shared<oout::FailureResult,char_const(&)[8]>(&local_c8);
  std::make_shared<oout::TestResult,std::shared_ptr<oout::FailureResult>>(&local_b8);
  std::make_shared<oout::NamedResult,char_const(&)[10],std::shared_ptr<oout::TestResult>>
            ((char (*) [10])local_a8,(shared_ptr<oout::TestResult> *)0x1a71d4);
  std::make_shared<oout::OoutReportText,std::shared_ptr<oout::NamedResult>>
            ((shared_ptr<oout::NamedResult> *)&local_98);
  std::make_shared<oout::ContainMatch,char_const(&)[19]>((char (*) [19])&local_d8);
  std::make_shared<oout::ContainMatch,char_const(&)[8]>((char (*) [8])&local_e8);
  std::make_shared<oout::ContainMatch,char_const(&)[20]>((char (*) [20])local_f8);
  std::
  make_shared<oout::NamedTest,char_const(&)[39],std::shared_ptr<oout::OoutReportText>,std::shared_ptr<oout::ContainMatch>,std::shared_ptr<oout::ContainMatch>,std::shared_ptr<oout::ContainMatch>>
            ((char (*) [39])&local_88,
             (shared_ptr<oout::OoutReportText> *)"OoutReportText should show failed test",&local_98,
             &local_d8,&local_e8);
  std::make_shared<oout::ErrorResult,char_const(&)[6]>((char (*) [6])local_148);
  std::make_shared<oout::TestResult,std::shared_ptr<oout::ErrorResult>>(&local_138);
  std::make_shared<oout::NamedResult,char_const(&)[10],std::shared_ptr<oout::TestResult>>
            ((char (*) [10])local_128,(shared_ptr<oout::TestResult> *)0x1a71d4);
  std::make_shared<oout::OoutReportText,std::shared_ptr<oout::NamedResult>>
            ((shared_ptr<oout::NamedResult> *)&local_118);
  std::make_shared<oout::ContainMatch,char_const(&)[17]>((char (*) [17])&local_158);
  std::make_shared<oout::ContainMatch,char_const(&)[6]>((char (*) [6])&local_168);
  std::make_shared<oout::ContainMatch,char_const(&)[20]>((char (*) [20])local_178);
  std::
  make_shared<oout::NamedTest,char_const(&)[38],std::shared_ptr<oout::OoutReportText>,std::shared_ptr<oout::ContainMatch>,std::shared_ptr<oout::ContainMatch>,std::shared_ptr<oout::ContainMatch>>
            ((char (*) [38])&local_108,
             (shared_ptr<oout::OoutReportText> *)"OoutReportText should show error test",&local_118,
             &local_158,&local_168);
  std::make_shared<oout::ErrorResult>();
  std::make_shared<oout::TestResult,std::shared_ptr<oout::ErrorResult>>(&local_1c8);
  std::make_shared<oout::NamedResult,char_const(&)[18],std::shared_ptr<oout::TestResult>>
            ((char (*) [18])local_1b8,(shared_ptr<oout::TestResult> *)0x1a7257);
  std::make_shared<oout::SuiteResult,std::shared_ptr<oout::NamedResult>>(&local_1a8);
  std::make_shared<oout::OoutReportText,std::shared_ptr<oout::SuiteResult>>
            ((shared_ptr<oout::SuiteResult> *)&local_198);
  std::make_shared<oout::ContainMatch,char_const(&)[25]>((char (*) [25])local_1e8);
  std::
  make_shared<oout::NamedTest,char_const(&)[39],std::shared_ptr<oout::OoutReportText>,std::shared_ptr<oout::ContainMatch>>
            ((char (*) [39])&local_188,
             (shared_ptr<oout::OoutReportText> *)"OoutReportText should show suite tests",&local_198
            );
  oout::dirty::Test::
  Test<std::shared_ptr<oout::NamedTest>,std::shared_ptr<oout::NamedTest>,std::shared_ptr<oout::NamedTest>,std::shared_ptr<oout::NamedTest>>
            (&this->super_Test,&local_28,&local_38,&local_88,&local_108,&local_188);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_188.super___shared_ptr<oout::NamedTest,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
  ;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(local_1e0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_198.super___shared_ptr<oout::ContainMatch,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_1a8.super___shared_ptr<oout::NamedResult,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_1b0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_1c8.super___shared_ptr<oout::ErrorResult,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_1d0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_108.super___shared_ptr<oout::NamedTest,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
  ;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_170);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_168.super___shared_ptr<oout::ContainMatch,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_158.super___shared_ptr<oout::ContainMatch,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_118.super___shared_ptr<oout::ContainMatch,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_120);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_138.super___shared_ptr<oout::ErrorResult,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_140);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_88.super___shared_ptr<oout::NamedTest,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_f0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_e8.super___shared_ptr<oout::ContainMatch,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_d8.super___shared_ptr<oout::ContainMatch,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_98.super___shared_ptr<oout::ContainMatch,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_a0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_b8.super___shared_ptr<oout::FailureResult,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_c0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_38.super___shared_ptr<oout::NamedTest,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(local_70);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_48.super___shared_ptr<oout::ContainMatch,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_58.super___shared_ptr<oout::SuccessResult,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_60);
  std::__cxx11::string::~string((string *)&local_28);
  (this->super_Test).super_Test._vptr_Test = (_func_int **)&PTR__Test_001cc558;
  return;
}

Assistant:

OoutReportTextTest::OoutReportTextTest()
: dirty::Test(
	"OoutReportText tests",
	make_shared<NamedTest>(
		"OoutReportText should show summary string",
		make_shared<OoutReportText>(
			make_shared<TestResult>(make_shared<SuccessResult>())
		),
		make_shared<ContainMatch>("0 of 1 tests failed")
	),
	make_shared<NamedTest>(
		"OoutReportText should show failed test",
		make_shared<OoutReportText>(
			make_shared<NamedResult>(
				"Test name",
				make_shared<TestResult>(make_shared<FailureResult>("failure"))
			)
		),
		make_shared<ContainMatch>("FAILURE: Test name"),
		make_shared<ContainMatch>("failure"),
		make_shared<ContainMatch>("1 of 1 tests failed")
	),
	make_shared<NamedTest>(
		"OoutReportText should show error test",
		make_shared<OoutReportText>(
			make_shared<NamedResult>(
				"Test name",
				make_shared<TestResult>(make_shared<ErrorResult>("error"))
			)
		),
		make_shared<ContainMatch>("ERROR: Test name"),
		make_shared<ContainMatch>("error"),
		make_shared<ContainMatch>("1 of 1 tests failed")
	),
	make_shared<NamedTest>(
		"OoutReportText should show suite tests",
		make_shared<OoutReportText>(
			make_shared<SuiteResult>(
				make_shared<NamedResult>(
					"Suite failed test",
					make_shared<TestResult>(make_shared<ErrorResult>())
				)
			)
		),
		make_shared<ContainMatch>("ERROR: Suite failed test")
	)
)
{
}